

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void foreach_rest_unit_in_plane
               (AV1Common *cm,int plane,rest_unit_visitor_t on_rest_unit,void *priv,int32_t *tmpbuf,
               RestorationLineBuffers *rlbs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int in_ESI;
  AV1_COMMON *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  int voffset;
  RestorationTileLimits limits;
  int h;
  int remaining_h;
  int i;
  int y0;
  int plane_h;
  int plane_w;
  int ext_size;
  int ss_y;
  int is_uv;
  int unit_size;
  int vnum_rest_units;
  int hnum_rest_units;
  RestorationInfo *rsi;
  int in_stack_ffffffffffffff40;
  int plane_00;
  int local_b4;
  uint3 in_stack_ffffffffffffff50;
  uint uVar6;
  int32_t *in_stack_ffffffffffffff58;
  int iVar7;
  int iVar8;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  uint uVar9;
  
  iVar1 = in_RDI->rst_info[in_ESI].restoration_unit_size;
  uVar6 = (uint)in_stack_ffffffffffffff50;
  if (0 < in_ESI != 0) {
    uVar6 = CONCAT13(in_RDI->seq_params->subsampling_y != 0,in_stack_ffffffffffffff50);
  }
  uVar9 = uVar6 >> 0x18;
  iVar2 = (iVar1 * 3) / 2;
  av1_get_upsampled_plane_size
            (in_RDI,(uint)(0 < in_ESI),(int *)&stack0xffffffffffffff7c,
             (int *)&stack0xffffffffffffff78);
  iVar7 = 0;
  for (iVar8 = 0; iVar8 < in_stack_ffffffffffffff78; iVar8 = local_b4 + iVar8) {
    iVar3 = in_stack_ffffffffffffff78 - iVar8;
    local_b4 = iVar1;
    if (iVar3 < iVar2) {
      local_b4 = iVar3;
    }
    iVar4 = iVar8 + local_b4;
    iVar5 = 8 >> ((byte)uVar9 & 0x1f);
    if (iVar8 - iVar5 < 0) {
      plane_00 = 0;
    }
    else {
      plane_00 = iVar8 - iVar5;
    }
    if (iVar4 < in_stack_ffffffffffffff78) {
      iVar4 = iVar4 - iVar5;
    }
    av1_foreach_rest_unit_in_row
              ((RestorationTileLimits *)0x0,0,av1_lr_sync_read_dummy,(int)((ulong)in_R9 >> 0x20),
               (int)in_R9,(int)((ulong)in_R8 >> 0x20),in_stack_ffffffffffffff40,plane_00,
               (void *)CONCAT44(iVar5,uVar6),in_stack_ffffffffffffff58,
               (RestorationLineBuffers *)CONCAT44(iVar4,plane_00),
               (sync_read_fn_t)CONCAT44(iVar3,local_b4),(sync_write_fn_t)CONCAT44(iVar8,iVar7),
               (AV1LrSyncData *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (aom_internal_error_info *)CONCAT44(uVar9,iVar2));
    iVar7 = iVar7 + 1;
  }
  return;
}

Assistant:

static void foreach_rest_unit_in_plane(const struct AV1Common *cm, int plane,
                                       rest_unit_visitor_t on_rest_unit,
                                       void *priv, int32_t *tmpbuf,
                                       RestorationLineBuffers *rlbs) {
  const RestorationInfo *rsi = &cm->rst_info[plane];
  const int hnum_rest_units = rsi->horz_units;
  const int vnum_rest_units = rsi->vert_units;
  const int unit_size = rsi->restoration_unit_size;

  const int is_uv = plane > 0;
  const int ss_y = is_uv && cm->seq_params->subsampling_y;
  const int ext_size = unit_size * 3 / 2;
  int plane_w, plane_h;
  av1_get_upsampled_plane_size(cm, is_uv, &plane_w, &plane_h);

  int y0 = 0, i = 0;
  while (y0 < plane_h) {
    int remaining_h = plane_h - y0;
    int h = (remaining_h < ext_size) ? remaining_h : unit_size;

    RestorationTileLimits limits;
    limits.v_start = y0;
    limits.v_end = y0 + h;
    assert(limits.v_end <= plane_h);
    // Offset upwards to align with the restoration processing stripe
    const int voffset = RESTORATION_UNIT_OFFSET >> ss_y;
    limits.v_start = AOMMAX(0, limits.v_start - voffset);
    if (limits.v_end < plane_h) limits.v_end -= voffset;

    av1_foreach_rest_unit_in_row(&limits, plane_w, on_rest_unit, i, unit_size,
                                 hnum_rest_units, vnum_rest_units, plane, priv,
                                 tmpbuf, rlbs, av1_lr_sync_read_dummy,
                                 av1_lr_sync_write_dummy, NULL, cm->error);

    y0 += h;
    ++i;
  }
}